

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O1

void read_16_rgb_555_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  long lVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  undefined7 in_register_00000081;
  long lVar3;
  
  lVar3 = (long)(int)(((length & 1U) + length) * 2);
  lVar1 = al_fread(f,buf,lVar3,CONCAT44(in_register_0000000c,length),
                   CONCAT71(in_register_00000081,premul));
  memset(buf + lVar1,0,lVar3 - lVar1);
  if (0 < length) {
    uVar2 = 0;
    do {
      *(uint *)(data + uVar2 * 4) =
           *(int *)(&_al_rgb_scale_5 +
                   ((ushort)(CONCAT11(buf[uVar2 * 2 + 1],buf[uVar2 * 2]) >> 3) & 0x7c)) << 8 |
           *(int *)(&_al_rgb_scale_5 + (ulong)((byte)buf[uVar2 * 2] & 0x1f) * 4) << 0x10 |
           *(uint *)(&_al_rgb_scale_5 + ((byte)buf[uVar2 * 2 + 1] & 0x7c)) | 0xff000000;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  return;
}

Assistant:

static void read_16_rgb_555_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = (length + (length & 1)) * 2;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; ++i) {
      uint16_t pixel = read_16le(buf + i*2);
      data32[i] = ALLEGRO_CONVERT_RGB_555_TO_ABGR_8888_LE(pixel);
   }
}